

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  DepthStencilBaseCase *this_01;
  mapped_type *ppcVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  NotSupportedError *this_02;
  long lVar3;
  undefined8 *puVar4;
  DepthStencilState *pDVar5;
  byte bVar6;
  StencilOpState local_148;
  StencilOpState local_128;
  undefined1 local_108 [8];
  void *pvStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [6];
  VkStencilOpState local_98;
  VkStencilOpState local_78;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_58;
  
  bVar6 = 0;
  this_01 = (DepthStencilBaseCase *)operator_new(0x2d0);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_58,&(this->m_shaderPaths)._M_t);
  local_108 = (undefined1  [8])((ulong)(uint)local_108._4_4_ << 0x20);
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,(key_type *)local_108);
  vertexShaderName = *ppcVar1;
  local_148.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,(key_type *)&local_148);
  DynamicState::anon_unknown_0::DepthStencilBaseCase::DepthStencilBaseCase
            (this_01,context,vertexShaderName,*ppcVar1);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DepthStencilBaseCase_00cfab70;
  pVVar2 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
  if (pVVar2->depthBounds != 0) {
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    this_00 = &this_01->m_data;
    local_108 = (undefined1  [8])0x3f800000bf800000;
    pvStack_100 = (void *)0x3f8000003ec00000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0x3f80000000000000;
    pvStack_100 = (void *)0x3f8000003ec00000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf800000bf800000;
    pvStack_100 = (void *)0x3f8000003ec00000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf80000000000000;
    pvStack_100 = (void *)0x3f8000003ec00000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0x3f80000000000000;
    pvStack_100 = (void *)0x3f8000003f200000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0x3f8000003f800000;
    pvStack_100 = (void *)0x3f8000003f200000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf80000000000000;
    pvStack_100 = (void *)0x3f8000003f200000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf8000003f800000;
    pvStack_100 = (void *)0x3f8000003f200000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0x3f800000bf800000;
    pvStack_100 = (void *)0x3f8000003f800000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0x3f8000003f800000;
    pvStack_100 = (void *)0x3f8000003f800000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf800000bf800000;
    pvStack_100 = (void *)0x3f8000003f800000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    local_128.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_128);
    local_108 = (undefined1  [8])0xbf8000003f800000;
    pvStack_100 = (void *)0x3f8000003f800000;
    local_f8[0]._0_8_ =
         CONCAT44(local_148.super_VkStencilOpState.passOp,local_148.super_VkStencilOpState.failOp);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)local_108)
    ;
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              (&local_148,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              (&local_128,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _back.super_VkStencilOpState.passOp = local_128.super_VkStencilOpState.passOp;
    _back.super_VkStencilOpState.failOp = local_128.super_VkStencilOpState.failOp;
    _front.super_VkStencilOpState.passOp = local_148.super_VkStencilOpState.passOp;
    _front.super_VkStencilOpState.failOp = local_148.super_VkStencilOpState.failOp;
    _front.super_VkStencilOpState.depthFailOp = local_148.super_VkStencilOpState.depthFailOp;
    _front.super_VkStencilOpState.compareOp = local_148.super_VkStencilOpState.compareOp;
    _front.super_VkStencilOpState.compareMask = local_148.super_VkStencilOpState.compareMask;
    _front.super_VkStencilOpState.writeMask = local_148.super_VkStencilOpState.writeMask;
    _front.super_VkStencilOpState.reference = local_148.super_VkStencilOpState.reference;
    _back.super_VkStencilOpState.depthFailOp = local_128.super_VkStencilOpState.depthFailOp;
    _back.super_VkStencilOpState.compareOp = local_128.super_VkStencilOpState.compareOp;
    _back.super_VkStencilOpState.compareMask = local_128.super_VkStencilOpState.compareMask;
    _back.super_VkStencilOpState.writeMask = local_128.super_VkStencilOpState.writeMask;
    _back.super_VkStencilOpState.reference = local_128.super_VkStencilOpState.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)local_108,1,1,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
    puVar4 = (undefined8 *)local_108;
    pDVar5 = &this_01->m_depthStencilState_1;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)&pDVar5->super_VkPipelineDepthStencilStateCreateInfo = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      pDVar5 = (DepthStencilState *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_78,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_98,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front_00.super_VkStencilOpState.depthFailOp = local_78.depthFailOp;
    _front_00.super_VkStencilOpState.failOp = local_78.failOp;
    _front_00.super_VkStencilOpState.passOp = local_78.passOp;
    _front_00.super_VkStencilOpState.compareOp = local_78.compareOp;
    _front_00.super_VkStencilOpState.compareMask = local_78.compareMask;
    _front_00.super_VkStencilOpState.writeMask = local_78.writeMask;
    _front_00.super_VkStencilOpState.reference = local_78.reference;
    _back_00.super_VkStencilOpState.depthFailOp = local_98.depthFailOp;
    _back_00.super_VkStencilOpState.failOp = local_98.failOp;
    _back_00.super_VkStencilOpState.passOp = local_98.passOp;
    _back_00.super_VkStencilOpState.compareOp = local_98.compareOp;
    _back_00.super_VkStencilOpState.compareMask = local_98.compareMask;
    _back_00.super_VkStencilOpState.writeMask = local_98.writeMask;
    _back_00.super_VkStencilOpState.reference = local_98.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              ((DepthStencilState *)local_108,0,0,VK_COMPARE_OP_NEVER,1,0,_front_00,_back_00,0.0,1.0
              );
    puVar4 = (undefined8 *)local_108;
    pDVar5 = &this_01->m_depthStencilState_2;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)&pDVar5->super_VkPipelineDepthStencilStateCreateInfo = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      pDVar5 = (DepthStencilState *)((long)pDVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    DynamicState::anon_unknown_0::DepthStencilBaseCase::initialize(this_01);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_58);
    return &this_01->super_TestInstance;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_108 = (undefined1  [8])local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"Depth bounds test is unsupported","");
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_108);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}